

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void writeBank(SortedSection *bankSections,uint16_t baseOffset,uint16_t size)

{
  Section *pSVar1;
  uint uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  
  if (bankSections == (SortedSection *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pSVar1 = bankSections->section;
      if (pSVar1->offset != 0) {
        __assert_fail("section->offset == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/output.cpp"
                      ,0xcb,"writeBank");
      }
      for (; (uint)uVar4 + (uint)baseOffset < (uint)pSVar1->org; uVar4 = uVar4 + 1) {
        if (overlayFile == (FILE *)0x0) {
          uVar2 = (uint)padValue;
        }
        else {
          uVar2 = getc((FILE *)overlayFile);
        }
        putc(uVar2,(FILE *)outputFile);
      }
      fwrite(pSVar1->data,1,(ulong)pSVar1->size,(FILE *)outputFile);
      if ((overlayFile != (FILE *)0x0) && (pSVar1->size != 0)) {
        uVar5 = 0;
        do {
          getc((FILE *)overlayFile);
          uVar5 = uVar5 + 1;
        } while (uVar5 < pSVar1->size);
      }
      uVar4 = uVar4 + pSVar1->size;
      bankSections = bankSections->next;
    } while (bankSections != (SortedSection *)0x0);
  }
  if ((disablePadding == false) && (uVar4 < size)) {
    sVar3 = size - uVar4;
    do {
      if (overlayFile == (FILE *)0x0) {
        uVar2 = (uint)padValue;
      }
      else {
        uVar2 = getc((FILE *)overlayFile);
      }
      putc(uVar2,(FILE *)outputFile);
      sVar3 = sVar3 + -1;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

static void writeBank(struct SortedSection *bankSections, uint16_t baseOffset,
		      uint16_t size)
{
	uint16_t offset = 0;

	while (bankSections) {
		struct Section const *section = bankSections->section;

		assert(section->offset == 0);
		// Output padding up to the next SECTION
		while (offset + baseOffset < section->org) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}

		// Output the section itself
		fwrite(section->data, sizeof(*section->data), section->size,
		       outputFile);
		if (overlayFile) {
			// Skip bytes even with pipes
			for (uint16_t i = 0; i < section->size; i++)
				getc(overlayFile);
		}
		offset += section->size;

		bankSections = bankSections->next;
	}

	if (!disablePadding) {
		while (offset < size) {
			putc(overlayFile ? getc(overlayFile) : padValue, outputFile);
			offset++;
		}
	}
}